

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x168;
  uint64_t x167;
  uint64_t x166;
  uint64_t x165;
  uint64_t x164;
  uint64_t x163;
  uint64_t x162;
  uint64_t x161;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x160;
  uint64_t x159;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x158;
  uint64_t x157;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
  uint64_t x155;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
  uint64_t x153;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
  uint64_t x151;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
  uint64_t x149;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
  uint64_t x147;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
  uint64_t x145;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
  uint64_t x143;
  uint64_t x142;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x141;
  uint64_t x140;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x139;
  uint64_t x138;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x137;
  uint64_t x136;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x135;
  uint64_t x134;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x133;
  uint64_t x132;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x131;
  uint64_t x130;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x129;
  uint64_t x128;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x127;
  uint64_t x126;
  uint64_t x125;
  uint64_t x124;
  uint64_t x123;
  uint64_t x122;
  uint64_t x121;
  uint64_t x120;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x119;
  uint64_t x118;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x117;
  uint64_t x116;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x115;
  uint64_t x114;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x113;
  uint64_t x112;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x111;
  uint64_t x110;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x109;
  uint64_t x108;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x107;
  uint64_t x106;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x105;
  uint64_t x104;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x103;
  uint64_t x102;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x101;
  uint64_t x100;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x99;
  uint64_t x98;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x97;
  uint64_t x96;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x95;
  uint64_t x94;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x93;
  uint64_t x92;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x91;
  uint64_t x90;
  uint64_t x89;
  uint64_t x88;
  uint64_t x87;
  uint64_t x86;
  uint64_t x85;
  uint64_t x84;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x83;
  uint64_t x82;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x81;
  uint64_t x80;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x79;
  uint64_t x78;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x77;
  uint64_t x76;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x75;
  uint64_t x74;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x73;
  uint64_t x72;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x71;
  uint64_t x70;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x69;
  uint64_t x68;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x67;
  uint64_t x66;
  uint64_t x65;
  uint64_t x64;
  uint64_t x63;
  uint64_t x62;
  uint64_t x61;
  uint64_t x60;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x59;
  uint64_t x58;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x57;
  uint64_t x56;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x47;
  uint64_t x46;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x45;
  uint64_t x44;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x43;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x35;
  uint64_t x34;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x33;
  uint64_t x32;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x31;
  uint64_t x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x23;
  uint64_t x22;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x21;
  uint64_t x20;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x19;
  uint64_t x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  uint64_t x14;
  uint64_t x13;
  uint64_t x12;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x11;
  uint64_t x10;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  uint64_t in_stack_fffffffffffffac8;
  uint64_t in_stack_fffffffffffffad0;
  undefined7 local_528;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffffadf;
  uint64_t *in_stack_fffffffffffffae0;
  undefined8 local_518;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_509;
  uint64_t local_508;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4f9;
  uint64_t local_4f8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4e9;
  uint64_t local_4e8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4d9;
  uint64_t local_4d8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4c9;
  uint64_t local_4c8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4b9;
  uint64_t local_4b8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4a9;
  uint64_t local_4a8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_499;
  uint64_t local_498;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_489;
  uint64_t local_488;
  uint64_t local_480;
  byte local_471;
  uint64_t local_470;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_461;
  uint64_t local_460;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_451;
  uint64_t local_450;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_441;
  uint64_t local_440;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_431;
  uint64_t local_430;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_421;
  uint64_t local_420;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_411;
  uint64_t local_410;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_401;
  uint64_t local_400;
  uint64_t local_3f8;
  uint64_t local_3f0;
  uint64_t local_3e8;
  uint64_t local_3e0;
  uint64_t local_3d8;
  uint64_t local_3d0;
  byte local_3c1;
  uint64_t local_3c0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3b1;
  uint64_t local_3b0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3a1;
  uint64_t local_3a0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_391;
  uint64_t local_390;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_381;
  uint64_t local_380;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_371;
  uint64_t local_370;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_361;
  uint64_t local_360;
  byte local_351;
  uint64_t local_350;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_341;
  uint64_t local_340;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_331;
  uint64_t local_330;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_321;
  uint64_t local_320;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_311;
  uint64_t local_310;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_301;
  uint64_t local_300;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2f1;
  uint64_t local_2f0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2e1;
  uint64_t local_2e0;
  uint64_t local_2d8;
  uint64_t local_2d0;
  uint64_t local_2c8;
  uint64_t local_2c0;
  uint64_t local_2b8;
  uint64_t local_2b0;
  byte local_2a1;
  uint64_t local_2a0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_291;
  uint64_t local_290;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_281;
  uint64_t local_280;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_271;
  uint64_t local_270;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_261;
  uint64_t local_260;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_251;
  uint64_t local_250;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_241;
  uint64_t local_240;
  byte local_231;
  uint64_t local_230;
  byte local_221;
  uint64_t local_220;
  uint64_t local_218;
  uint64_t local_210;
  uint64_t local_208;
  uint64_t local_200;
  uint64_t local_1f8;
  uint64_t local_1f0;
  byte local_1e1;
  uint64_t local_1e0;
  byte local_1d1;
  uint64_t local_1d0;
  byte local_1c1;
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  byte local_181;
  uint64_t local_180;
  byte local_171;
  uint64_t local_170;
  byte local_161;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  uint64_t local_130;
  byte local_121;
  uint64_t local_120;
  byte local_111;
  uint64_t local_110;
  byte local_101;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  byte local_c1;
  uint64_t local_c0;
  byte local_b1;
  uint64_t local_b0;
  byte local_a1;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  byte local_61;
  uint64_t local_60;
  byte local_51;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_18 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_20,&local_28,local_18,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_30,&local_38,local_20,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_40,&local_48,local_20,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_50,&local_51,'\0',local_18,local_40);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_60,&local_61,'\0',local_51 + local_48,local_10[1]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_70,&local_78,local_60,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_80,&local_88,local_70,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_90,&local_98,local_70,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_a0,&local_a1,'\0',local_38,local_80);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_b0,&local_b1,'\0',local_60,local_90);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_c0,&local_c1,'\0',(ulong)local_b1 + (ulong)local_61 + local_98,local_10[2]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_d0,&local_d8,local_c0,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_e0,&local_e8,local_d0,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_f0,&local_f8,local_d0,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_100,&local_101,'\0',local_a1 + local_88,local_e0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_110,&local_111,'\0',local_c0,local_f0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_120,&local_121,'\0',(ulong)local_111 + (ulong)local_c1 + local_f8,local_10[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_130,&local_138,local_120,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_140,&local_148,local_130,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_150,&local_158,local_130,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_160,&local_161,'\0',local_101 + local_e8,local_140);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_170,&local_171,'\0',local_120,local_150);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_180,&local_181,'\0',(ulong)local_171 + (ulong)local_121 + local_158,local_10[4])
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_190,&local_198,local_180,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_1a0,&local_1a8,local_190,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_1b0,&local_1b8,local_190,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_1c0,&local_1c1,'\0',local_161 + local_148,local_1a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_1d0,&local_1d1,'\0',local_180,local_1b0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_1e0,&local_1e1,'\0',(ulong)local_1d1 + (ulong)local_181 + local_1b8,local_10[5])
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_1f0,&local_1f8,local_1e0,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_200,&local_208,local_1f0,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_210,&local_218,local_1f0,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_220,&local_221,'\0',local_1c1 + local_1a8,local_200);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_230,&local_231,'\0',local_1e0,local_210);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_240,&local_241,'\0',(ulong)local_231 + (ulong)local_1e1 + local_218,local_10[6])
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_250,&local_251,local_241,local_30,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_260,&local_261,local_251,local_a0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_270,&local_271,local_261,local_100,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_280,&local_281,local_271,local_160,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_290,&local_291,local_281,local_1c0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2a0,&local_2a1,local_291,local_220,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_2b0,&local_2b8,local_240,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_2c0,&local_2c8,local_2b0,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_2d0,&local_2d8,local_2b0,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2e0,&local_2e1,'\0',local_240,local_2d0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2f0,&local_2f1,local_2e1,local_250,local_2d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_300,&local_301,local_2f1,local_260,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_310,&local_311,local_301,local_270,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_320,&local_321,local_311,local_280,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_330,&local_331,local_321,local_290,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_340,&local_341,local_331,local_2a0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_350,&local_351,local_341,(ulong)local_2a1 + local_221 + local_208,local_2c0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_360,&local_361,'\0',local_2f0,local_10[7]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_370,&local_371,local_361,local_300,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_380,&local_381,local_371,local_310,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_390,&local_391,local_381,local_320,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3a0,&local_3a1,local_391,local_330,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3b0,&local_3b1,local_3a1,local_340,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3c0,&local_3c1,local_3b1,local_350,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_3d0,&local_3d8,local_360,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_3e0,&local_3e8,local_3d0,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_3f0,&local_3f8,local_3d0,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_400,&local_401,'\0',local_360,local_3f0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_410,&local_411,local_401,local_370,local_3f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_420,&local_421,local_411,local_380,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_430,&local_431,local_421,local_390,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_440,&local_441,local_431,local_3a0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_450,&local_451,local_441,local_3b0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_460,&local_461,local_451,local_3c0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_470,&local_471,local_461,(ulong)local_3c1 + local_351 + local_2c8,local_3e0);
  local_480 = local_471 + local_3e8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_488,&local_489,'\0',local_410,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_498,&local_499,local_489,local_420,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4a8,&local_4a9,local_499,local_430,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4b8,&local_4b9,local_4a9,local_440,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4c8,&local_4c9,local_4b9,local_450,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4d8,&local_4d9,local_4c9,local_460,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4e8,&local_4e9,local_4d9,local_470,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_4f8,&local_4f9,local_4e9,local_480,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_508,&local_509,local_4f9,0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadf,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8);
  *local_8 = local_518;
  local_8[1] = in_stack_fffffffffffffae0;
  local_8[2] = CONCAT17(in_stack_fffffffffffffadf,local_528);
  local_8[3] = in_stack_fffffffffffffad0;
  local_8[4] = in_stack_fffffffffffffac8;
  local_8[5] = local_540;
  local_8[6] = local_548;
  local_8[7] = local_550;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(
    uint64_t out1[8], const uint64_t arg1[8]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x9;
    uint64_t x10;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x19;
    uint64_t x20;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x21;
    uint64_t x22;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x31;
    uint64_t x32;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x33;
    uint64_t x34;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x43;
    uint64_t x44;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x45;
    uint64_t x46;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x55;
    uint64_t x56;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x57;
    uint64_t x58;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x67;
    uint64_t x68;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x69;
    uint64_t x70;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x71;
    uint64_t x72;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x73;
    uint64_t x74;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x75;
    uint64_t x76;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x77;
    uint64_t x78;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x79;
    uint64_t x80;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x81;
    uint64_t x82;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    uint64_t x87;
    uint64_t x88;
    uint64_t x89;
    uint64_t x90;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x91;
    uint64_t x92;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x93;
    uint64_t x94;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x95;
    uint64_t x96;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x97;
    uint64_t x98;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x99;
    uint64_t x100;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x101;
    uint64_t x102;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x103;
    uint64_t x104;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x105;
    uint64_t x106;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x107;
    uint64_t x108;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x109;
    uint64_t x110;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x111;
    uint64_t x112;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x113;
    uint64_t x114;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x115;
    uint64_t x116;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x117;
    uint64_t x118;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    uint64_t x126;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x127;
    uint64_t x128;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x129;
    uint64_t x130;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x131;
    uint64_t x132;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x133;
    uint64_t x134;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x135;
    uint64_t x136;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x137;
    uint64_t x138;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x139;
    uint64_t x140;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x141;
    uint64_t x142;
    uint64_t x143;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
    uint64_t x145;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
    uint64_t x147;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
    uint64_t x149;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
    uint64_t x151;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
    uint64_t x153;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
    uint64_t x155;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
    uint64_t x157;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x158;
    uint64_t x159;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x160;
    uint64_t x161;
    uint64_t x162;
    uint64_t x163;
    uint64_t x164;
    uint64_t x165;
    uint64_t x166;
    uint64_t x167;
    uint64_t x168;
    x1 = (arg1[0]);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x2, &x3, x1, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x4, &x5, x2, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x6, &x7, x2,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x8, &x9, 0x0, x1,
                                                            x6);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x10, &x11, 0x0, (x9 + x7), (arg1[1]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x12, &x13, x10, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x14, &x15, x12, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x16, &x17, x12,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x18, &x19, 0x0, x5,
                                                            x14);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x20, &x21, 0x0,
                                                            x10, x16);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x22, &x23, 0x0, (((uint64_t)x21 + x11) + x17), (arg1[2]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x24, &x25, x22, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x26, &x27, x24, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x28, &x29, x24,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x30, &x31, 0x0,
                                                            (x19 + x15), x26);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x32, &x33, 0x0,
                                                            x22, x28);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x34, &x35, 0x0, (((uint64_t)x33 + x23) + x29), (arg1[3]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x36, &x37, x34, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x38, &x39, x36, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x40, &x41, x36,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x42, &x43, 0x0,
                                                            (x31 + x27), x38);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x44, &x45, 0x0,
                                                            x34, x40);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x46, &x47, 0x0, (((uint64_t)x45 + x35) + x41), (arg1[4]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x48, &x49, x46, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x50, &x51, x48, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x52, &x53, x48,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x54, &x55, 0x0,
                                                            (x43 + x39), x50);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x56, &x57, 0x0,
                                                            x46, x52);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x58, &x59, 0x0, (((uint64_t)x57 + x47) + x53), (arg1[5]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x60, &x61, x58, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x62, &x63, x60, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x64, &x65, x60,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x66, &x67, 0x0,
                                                            (x55 + x51), x62);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x68, &x69, 0x0,
                                                            x58, x64);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x70, &x71, 0x0, (((uint64_t)x69 + x59) + x65), (arg1[6]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x72, &x73, x71, x4,
                                                            0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x74, &x75, x73,
                                                            x18, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x76, &x77, x75,
                                                            x30, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x78, &x79, x77,
                                                            x42, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x80, &x81, x79,
                                                            x54, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x82, &x83, x81,
                                                            x66, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x84, &x85, x70, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x86, &x87, x84, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x88, &x89, x84,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x90, &x91, 0x0,
                                                            x70, x88);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x92, &x93, x91,
                                                            x72, x89);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x94, &x95, x93,
                                                            x74, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x96, &x97, x95,
                                                            x76, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x98, &x99, x97,
                                                            x78, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x100, &x101, x99,
                                                            x80, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x102, &x103, x101,
                                                            x82, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x104, &x105, x103, (x83 + (x67 + x63)), x86);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x106, &x107, 0x0,
                                                            x92, (arg1[7]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x108, &x109, x107,
                                                            x94, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x110, &x111, x109,
                                                            x96, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x112, &x113, x111,
                                                            x98, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x114, &x115, x113,
                                                            x100, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x116, &x117, x115,
                                                            x102, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x118, &x119, x117,
                                                            x104, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x120, &x121, x106, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x122, &x123, x120, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x124, &x125, x120,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x126, &x127, 0x0,
                                                            x106, x124);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x128, &x129, x127,
                                                            x108, x125);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x130, &x131, x129,
                                                            x110, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x132, &x133, x131,
                                                            x112, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x134, &x135, x133,
                                                            x114, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x136, &x137, x135,
                                                            x116, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x138, &x139, x137,
                                                            x118, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x140, &x141, x139, (x119 + (x105 + x87)), x122);
    x142 = (x141 + x123);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x143, &x144, 0x0, x128, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x145, &x146, x144,
                                                             x130, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x147, &x148, x146,
                                                             x132, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x149, &x150, x148,
                                                             x134, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x151, &x152, x150,
                                                             x136, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x153, &x154, x152,
                                                             x138, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x155, &x156, x154,
                                                             x140, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x157, &x158, x156, x142, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x159, &x160, x158,
                                                             0x0, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x161, x160, x143,
                                                          x128);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x162, x160, x145,
                                                          x130);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x163, x160, x147,
                                                          x132);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x164, x160, x149,
                                                          x134);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x165, x160, x151,
                                                          x136);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x166, x160, x153,
                                                          x138);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x167, x160, x155,
                                                          x140);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x168, x160, x157,
                                                          x142);
    out1[0] = x161;
    out1[1] = x162;
    out1[2] = x163;
    out1[3] = x164;
    out1[4] = x165;
    out1[5] = x166;
    out1[6] = x167;
    out1[7] = x168;
}